

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

String __thiscall testing::internal::FormatForFailureMessage(internal *this,char ch)

{
  char *pcVar1;
  size_t extraout_RDX;
  undefined7 in_register_00000031;
  ulong uVar3;
  String SVar4;
  char *local_28 [2];
  size_t sVar2;
  
  uVar3 = CONCAT71(in_register_00000031,ch);
  if (ch == '\0') {
    pcVar1 = "\\0";
  }
  else {
    String::Format((char *)local_28,"%c",uVar3 & 0xffffffff);
    pcVar1 = local_28[0];
  }
  SVar4 = String::Format((char *)this,"\'%s\' (%u, 0x%X)",pcVar1,uVar3 & 0xffffffff,
                         uVar3 & 0xffffffff);
  sVar2 = SVar4.length_;
  if ((ch != '\0') && (local_28[0] != (char *)0x0)) {
    operator_delete__(local_28[0]);
    sVar2 = extraout_RDX;
  }
  SVar4.length_ = sVar2;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String FormatForFailureMessage(char ch) {
  const unsigned int ch_as_uint = ch;
  // A String object cannot contain '\0', so we print "\\0" when ch is
  // '\0'.
  return String::Format("'%s' (%u, 0x%X)",
                        ch ? String::Format("%c", ch).c_str() : "\\0",
                        ch_as_uint, ch_as_uint);
}